

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O0

string * __thiscall
font2svg::glyph::svgheader_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  ostream *poVar1;
  allocator<char> local_39;
  string local_38 [32];
  glyph *local_18;
  glyph *this_local;
  
  local_18 = this;
  this_local = (glyph *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
  std::__cxx11::stringstream::str((string *)&this->tmp);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  poVar1 = std::operator<<((ostream *)&this->field_0x270,"\n<svg width=\'");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbwidth);
  poVar1 = std::operator<<(poVar1,"px\'");
  poVar1 = std::operator<<(poVar1," height=\'");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbheight);
  poVar1 = std::operator<<(poVar1,"px\'");
  std::operator<<(poVar1," xmlns=\'http://www.w3.org/2000/svg\' version=\'1.1\'>");
  std::__cxx11::stringstream::str();
  return __return_storage_ptr__;
}

Assistant:

std::string svgheader() {
		tmp.str("");

		tmp << "\n<svg width='" << bbwidth << "px'"
			<< " height='" << bbheight << "px'"
			<< " xmlns='http://www.w3.org/2000/svg' version='1.1'>";

		return tmp.str();
	}